

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ReturnStmt * __thiscall parser::Parser::parseReturnStatement(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  ReturnStmt *pRVar3;
  Expr *pEVar4;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  pRVar3 = (ReturnStmt *)operator_new(0x48);
  TVar1 = (this->curToken).Type;
  pcVar2 = (this->curToken).Literal._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (this->curToken).Literal._M_string_length);
  (pRVar3->super_Stmt).super_Node.lineno = this->l->line;
  (pRVar3->super_Stmt).super_Node.type_value = ReturnStmtType;
  (pRVar3->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__ReturnStmt_00125048;
  (pRVar3->tok)._vptr_Token = (_func_int **)&PTR__Token_001258b0;
  (pRVar3->tok).Type = TVar1;
  (pRVar3->tok).Literal._M_dataplus._M_p = (pointer)&(pRVar3->tok).Literal.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pRVar3->tok).Literal,local_40,local_38 + (long)local_40);
  pRVar3->returnValue = (Expr *)0x0;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  nextToken(this);
  pEVar4 = parseExpression(this);
  pRVar3->returnValue = pEVar4;
  return pRVar3;
}

Assistant:

ReturnStmt* Parser::parseReturnStatement()
{
    ReturnStmt* stmt = new ReturnStmt(curToken, l->line);
    nextToken();
    stmt->returnValue = parseExpression();
    return stmt;
}